

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

void ChopUpSingleUncompressedStrip(TIFF *tif)

{
  TIFFDirEntry *dirent;
  uint64_t **parray;
  uint uVar1;
  uint64_t uVar2;
  uint64_t stripbytes;
  toff_t tVar3;
  uint uVar4;
  uint nrows;
  
  dirent = &(tif->tif_dir).td_stripbytecount_entry;
  parray = &(tif->tif_dir).td_stripbytecount_p;
  uVar2 = _TIFFGetStrileOffsetOrByteCountValue(tif,0,dirent,parray,(int *)0x0);
  if ((uVar2 != 0) || (tif->tif_mode == 0)) {
    uVar2 = _TIFFGetStrileOffsetOrByteCountValue(tif,0,dirent,parray,(int *)0x0);
    if ((tif->tif_dir).td_planarconfig != 1) {
      __assert_fail("td->td_planarconfig == PLANARCONFIG_CONTIG",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                    ,0x1caa,"void ChopUpSingleUncompressedStrip(TIFF *)");
    }
    nrows = 1;
    if (((tif->tif_dir).td_photometric == 6) && ((tif->tif_flags & 0x4000) == 0)) {
      nrows = (uint)(tif->tif_dir).td_ycbcrsubsampling[1];
    }
    stripbytes = TIFFVTileSize64(tif,nrows);
    if (stripbytes < 0x2001) {
      if (stripbytes == 0) {
        return;
      }
      uVar1 = 0x2000 / (ushort)stripbytes;
      nrows = nrows * uVar1;
      stripbytes = stripbytes * (ushort)uVar1;
    }
    if ((((nrows < (tif->tif_dir).td_rowsperstrip) &&
         (uVar1 = (tif->tif_dir).td_imagelength, uVar1 < -nrows)) &&
        (uVar4 = (nrows + uVar1) - 1, uVar1 = uVar4 / nrows, nrows <= uVar4)) &&
       (((uVar1 < 0xf4241 || (tif->tif_mode != 0)) ||
        ((tVar3 = (*tif->tif_sizeproc)(tif->tif_clientdata), uVar2 < tVar3 &&
         (tVar3 = (*tif->tif_sizeproc)(tif->tif_clientdata),
         stripbytes <= (tVar3 - uVar2) / (ulong)(uVar1 - 1))))))) {
      allocChoppedUpStripArrays(tif,uVar1,stripbytes,nrows);
      return;
    }
  }
  return;
}

Assistant:

static void ChopUpSingleUncompressedStrip(TIFF *tif)
{
    register TIFFDirectory *td = &tif->tif_dir;
    uint64_t bytecount;
    uint64_t offset;
    uint32_t rowblock;
    uint64_t rowblockbytes;
    uint64_t stripbytes;
    uint32_t nstrips;
    uint32_t rowsperstrip;

    bytecount = TIFFGetStrileByteCount(tif, 0);
    /* On a newly created file, just re-opened to be filled, we */
    /* don't want strip chop to trigger as it is going to cause issues */
    /* later ( StripOffsets and StripByteCounts improperly filled) . */
    if (bytecount == 0 && tif->tif_mode != O_RDONLY)
        return;
    offset = TIFFGetStrileByteCount(tif, 0);
    assert(td->td_planarconfig == PLANARCONFIG_CONTIG);
    if ((td->td_photometric == PHOTOMETRIC_YCBCR) && (!isUpSampled(tif)))
        rowblock = td->td_ycbcrsubsampling[1];
    else
        rowblock = 1;
    rowblockbytes = TIFFVTileSize64(tif, rowblock);
    /*
     * Make the rows hold at least one scanline, but fill specified amount
     * of data if possible.
     */
    if (rowblockbytes > STRIP_SIZE_DEFAULT)
    {
        stripbytes = rowblockbytes;
        rowsperstrip = rowblock;
    }
    else if (rowblockbytes > 0)
    {
        uint32_t rowblocksperstrip;
        rowblocksperstrip = (uint32_t)(STRIP_SIZE_DEFAULT / rowblockbytes);
        rowsperstrip = rowblocksperstrip * rowblock;
        stripbytes = rowblocksperstrip * rowblockbytes;
    }
    else
        return;

    /*
     * never increase the number of rows per strip
     */
    if (rowsperstrip >= td->td_rowsperstrip)
        return;
    nstrips = TIFFhowmany_32(td->td_imagelength, rowsperstrip);
    if (nstrips == 0)
        return;

    /* If we are going to allocate a lot of memory, make sure that the */
    /* file is as big as needed */
    if (tif->tif_mode == O_RDONLY && nstrips > 1000000 &&
        (offset >= TIFFGetFileSize(tif) ||
         stripbytes > (TIFFGetFileSize(tif) - offset) / (nstrips - 1)))
    {
        return;
    }

    allocChoppedUpStripArrays(tif, nstrips, stripbytes, rowsperstrip);
}